

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void __thiscall icu_63::Normalizer2DataBuilder::postProcess(Normalizer2DataBuilder *this,Norm *norm)

{
  UBool UVar1;
  uint8_t uVar2;
  int32_t iVar3;
  UChar32 c;
  bool local_ac;
  byte local_ab;
  bool local_aa;
  byte local_a9;
  undefined1 local_a0 [8];
  BuilderReorderingBuffer buffer;
  Norm *norm_local;
  Normalizer2DataBuilder *this_local;
  
  buffer._128_8_ = norm;
  UVar1 = Norm::hasMapping(norm);
  if (UVar1 == '\0') {
    *(undefined1 *)(buffer._128_8_ + 0x2a) = *(undefined1 *)(buffer._128_8_ + 0x28);
    *(undefined1 *)(buffer._128_8_ + 0x29) = *(undefined1 *)(buffer._128_8_ + 0x28);
    local_ab = 0;
    if (*(char *)(buffer._128_8_ + 0x28) == '\0') {
      local_ab = *(char *)(buffer._128_8_ + 0x2b) != '\0' ^ 0xff;
    }
    *(byte *)(buffer._128_8_ + 0x2c) = local_ab & 1;
    local_ac = false;
    if ((*(char *)(buffer._128_8_ + 0x28) == '\0') &&
       (local_ac = false, *(char *)(buffer._128_8_ + 0x2b) == '\0')) {
      local_ac = *(long *)(buffer._128_8_ + 0x20) == 0;
    }
    *(bool *)(buffer._128_8_ + 0x2d) = local_ac;
    if (*(char *)(buffer._128_8_ + 0x2b) == '\0') {
      if (*(long *)(buffer._128_8_ + 0x20) == 0) {
        if (*(char *)(buffer._128_8_ + 0x28) == '\0') {
          *(undefined4 *)(buffer._128_8_ + 0x30) = 1;
        }
        else {
          *(undefined4 *)(buffer._128_8_ + 0x30) = 0xc;
        }
      }
      else {
        *(undefined4 *)(buffer._128_8_ + 0x30) = 2;
      }
    }
    else if (*(long *)(buffer._128_8_ + 0x20) == 0) {
      *(undefined4 *)(buffer._128_8_ + 0x30) = 0xb;
    }
    else {
      *(undefined4 *)(buffer._128_8_ + 0x30) = 10;
    }
  }
  else {
    iVar3 = UnicodeString::length(*(UnicodeString **)buffer._128_8_);
    if (iVar3 < 0x20) {
      BuilderReorderingBuffer::BuilderReorderingBuffer((BuilderReorderingBuffer *)local_a0);
      if (*(long *)(buffer._128_8_ + 8) != 0) {
        Norms::reorder(&this->norms,*(UnicodeString **)(buffer._128_8_ + 8),
                       (BuilderReorderingBuffer *)local_a0);
        BuilderReorderingBuffer::reset((BuilderReorderingBuffer *)local_a0);
      }
      Norms::reorder(&this->norms,*(UnicodeString **)buffer._128_8_,
                     (BuilderReorderingBuffer *)local_a0);
      UVar1 = BuilderReorderingBuffer::isEmpty((BuilderReorderingBuffer *)local_a0);
      if (UVar1 == '\0') {
        uVar2 = BuilderReorderingBuffer::ccAt((BuilderReorderingBuffer *)local_a0,0);
        *(uint8_t *)(buffer._128_8_ + 0x29) = uVar2;
        iVar3 = BuilderReorderingBuffer::length((BuilderReorderingBuffer *)local_a0);
        uVar2 = BuilderReorderingBuffer::ccAt((BuilderReorderingBuffer *)local_a0,iVar3 + -1);
        *(uint8_t *)(buffer._128_8_ + 0x2a) = uVar2;
      }
      else {
        *(undefined1 *)(buffer._128_8_ + 0x29) = 1;
        *(undefined1 *)(buffer._128_8_ + 0x2a) = 0xff;
      }
      UVar1 = BuilderReorderingBuffer::isEmpty((BuilderReorderingBuffer *)local_a0);
      local_a9 = 0;
      if ((UVar1 == '\0') && (local_a9 = 0, *(char *)(buffer._128_8_ + 0x29) == '\0')) {
        c = BuilderReorderingBuffer::charAt((BuilderReorderingBuffer *)local_a0,0);
        UVar1 = Norms::combinesBack(&this->norms,c);
        local_a9 = UVar1 != '\0' ^ 0xff;
      }
      *(byte *)(buffer._128_8_ + 0x2c) = local_a9 & 1;
      local_aa = false;
      if (*(long *)(buffer._128_8_ + 0x20) == 0) {
        UVar1 = mappingHasCompBoundaryAfter
                          (this,(BuilderReorderingBuffer *)local_a0,
                           *(MappingType *)(buffer._128_8_ + 0x18));
        local_aa = UVar1 != '\0';
      }
      *(bool *)(buffer._128_8_ + 0x2d) = local_aa;
      if (*(char *)(buffer._128_8_ + 0x2b) == '\0') {
        if (*(int *)(buffer._128_8_ + 0x18) == 2) {
          if (*(long *)(buffer._128_8_ + 0x20) == 0) {
            *(undefined4 *)(buffer._128_8_ + 0x30) = 4;
          }
          else {
            *(undefined4 *)(buffer._128_8_ + 0x30) = 3;
          }
        }
        else if (*(long *)(buffer._128_8_ + 0x20) == 0) {
          UVar1 = BuilderReorderingBuffer::isEmpty((BuilderReorderingBuffer *)local_a0);
          if (UVar1 == '\0') {
            if (*(char *)(buffer._128_8_ + 0x2c) == '\0') {
              *(undefined4 *)(buffer._128_8_ + 0x30) = 7;
            }
            else {
              UVar1 = mappingRecomposes(this,(BuilderReorderingBuffer *)local_a0);
              if (UVar1 == '\0') {
                *(undefined4 *)(buffer._128_8_ + 0x30) = 5;
              }
              else {
                *(undefined4 *)(buffer._128_8_ + 0x30) = 6;
              }
            }
          }
          else {
            *(undefined4 *)(buffer._128_8_ + 0x30) = 8;
          }
        }
        else {
          *(char **)(buffer._128_8_ + 0x38) =
               "combines-forward and has a one-way mapping, not possible in Unicode normalization";
        }
      }
      else {
        *(char **)(buffer._128_8_ + 0x38) =
             "combines-back and decomposes, not possible in Unicode normalization";
      }
    }
    else {
      *(char **)(buffer._128_8_ + 0x38) = "mapping longer than maximum of 31";
    }
  }
  return;
}

Assistant:

void Normalizer2DataBuilder::postProcess(Norm &norm) {
    // Prerequisites: Compositions are built, mappings are recursively decomposed.
    // Mappings are not yet in canonical order.
    //
    // This function works on a Norm struct. We do not know which code point(s) map(s) to it.
    // Therefore, we cannot compute algorithmic mapping deltas here.
    // Error conditions are checked, but printed later when we do know the offending code point.
    if(norm.hasMapping()) {
        if(norm.mapping->length()>Normalizer2Impl::MAPPING_LENGTH_MASK) {
            norm.error="mapping longer than maximum of 31";
            return;
        }
        // Ensure canonical order.
        BuilderReorderingBuffer buffer;
        if(norm.rawMapping!=nullptr) {
            norms.reorder(*norm.rawMapping, buffer);
            buffer.reset();
        }
        norms.reorder(*norm.mapping, buffer);
        if(buffer.isEmpty()) {
            // A character that is deleted (maps to an empty string) must
            // get the worst-case lccc and tccc values because arbitrary
            // characters on both sides will become adjacent.
            norm.leadCC=1;
            norm.trailCC=0xff;
        } else {
            norm.leadCC=buffer.ccAt(0);
            norm.trailCC=buffer.ccAt(buffer.length()-1);
        }

        norm.hasCompBoundaryBefore=
            !buffer.isEmpty() && norm.leadCC==0 && !norms.combinesBack(buffer.charAt(0));
        norm.hasCompBoundaryAfter=
            norm.compositions==nullptr && mappingHasCompBoundaryAfter(buffer, norm.mappingType);

        if(norm.combinesBack) {
            norm.error="combines-back and decomposes, not possible in Unicode normalization";
        } else if(norm.mappingType==Norm::ROUND_TRIP) {
            if(norm.compositions!=NULL) {
                norm.type=Norm::YES_NO_COMBINES_FWD;
            } else {
                norm.type=Norm::YES_NO_MAPPING_ONLY;
            }
        } else {  // one-way mapping
            if(norm.compositions!=NULL) {
                norm.error="combines-forward and has a one-way mapping, "
                           "not possible in Unicode normalization";
            } else if(buffer.isEmpty()) {
                norm.type=Norm::NO_NO_EMPTY;
            } else if(!norm.hasCompBoundaryBefore) {
                norm.type=Norm::NO_NO_COMP_NO_MAYBE_CC;
            } else if(mappingRecomposes(buffer)) {
                norm.type=Norm::NO_NO_COMP_BOUNDARY_BEFORE;
            } else {
                // The mapping is comp-normalized.
                norm.type=Norm::NO_NO_COMP_YES;
            }
        }
    } else {  // no mapping
        norm.leadCC=norm.trailCC=norm.cc;

        norm.hasCompBoundaryBefore=
            norm.cc==0 && !norm.combinesBack;
        norm.hasCompBoundaryAfter=
            norm.cc==0 && !norm.combinesBack && norm.compositions==nullptr;

        if(norm.combinesBack) {
            if(norm.compositions!=nullptr) {
                // Earlier code checked ccc=0.
                norm.type=Norm::MAYBE_YES_COMBINES_FWD;
            } else {
                norm.type=Norm::MAYBE_YES_SIMPLE;  // any ccc
            }
        } else if(norm.compositions!=nullptr) {
            // Earlier code checked ccc=0.
            norm.type=Norm::YES_YES_COMBINES_FWD;
        } else if(norm.cc!=0) {
            norm.type=Norm::YES_YES_WITH_CC;
        } else {
            norm.type=Norm::INERT;
        }
    }
}